

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O2

void container_suite::test_set_empty(void)

{
  value_type input [5];
  type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> value;
  iarchive in;
  undefined4 local_ec;
  uchar local_e8 [8];
  size_t local_e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d8;
  iarchive local_a8;
  
  local_e8[4] = 0x91;
  local_e8[0] = 0x90;
  local_e8[1] = 0x92;
  local_e8[2] = 0x82;
  local_e8[3] = 0x93;
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[5]>(&local_a8,(uchar (*) [5])local_e8)
  ;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::archive::detail::load_non_pointer_type<trial::protocol::bintoken::iarchive>::load_standard
  ::invoke<container_suite::type_struct<std::set<int,std::less<int>,std::allocator<int>>>>
            (&local_a8,
             (type_struct<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)&local_d8);
  local_e0 = local_d8._M_impl.super__Rb_tree_header._M_node_count;
  local_ec = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value.data.size()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0x324,"void container_suite::test_set_empty()",&local_e0,&local_ec);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_d8);
  trial::protocol::bintoken::iarchive::~iarchive(&local_a8);
  return;
}

Assistant:

void test_set_empty()
{
    const value_type input[] = { token::code::begin_record,
                                 token::code::begin_array,
                                 token::code::null,
                                 token::code::end_array,
                                 token::code::end_record };
    format::iarchive in(input);
    type_struct< std::set<int> > value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value.data.size(), 0);
}